

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

Gia_Man_t * Gia_ManAigSyn4(Gia_Man_t *p,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Jf_Par_t *pPars;
  Jf_Par_t Pars;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fVeryVerbose_local;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  Jf_ManSetDefaultPars((Jf_Par_t *)&pPars);
  Pars.nRounds = 0x28;
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  iVar1 = Gia_ManAndNum(p);
  if (iVar1 == 0) {
    p_local = Gia_ManDup(p);
  }
  else {
    Pars.pTimesReq = (float *)Gia_ManAreaBalance(p,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats((Gia_Man_t *)Pars.pTimesReq,(Gps_Par_t *)0x0);
    }
    pPars._0_4_ = 7;
    pGVar2 = Jf_ManPerformMapping((Gia_Man_t *)Pars.pTimesReq,(Jf_Par_t *)&pPars);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Pars.pTimesReq = (float *)pGVar2;
    pGVar2 = Gia_ManPerformFx(pGVar2,1000000000,0,0,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Gia_ManStop((Gia_Man_t *)Pars.pTimesReq);
    Pars.pTimesReq = (float *)pGVar2;
    pGVar2 = Gia_ManAreaBalance(pGVar2,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Gia_ManStop((Gia_Man_t *)Pars.pTimesReq);
    pPars._0_4_ = 5;
    Pars.pTimesReq = (float *)pGVar2;
    pGVar2 = Jf_ManPerformMapping(pGVar2,(Jf_Par_t *)&pPars);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Pars.pTimesReq = (float *)pGVar2;
    pGVar2 = Gia_ManPerformFx(pGVar2,1000000000,0,0,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
    }
    Gia_ManStop((Gia_Man_t *)Pars.pTimesReq);
    Pars.pTimesReq = (float *)pGVar2;
    p_local = Gia_ManAreaBalance(pGVar2,0,1000000000,fVeryVerbose,0);
    if (fVerbose != 0) {
      Gia_ManPrintStats(p_local,(Gps_Par_t *)0x0);
    }
    Gia_ManStop((Gia_Man_t *)Pars.pTimesReq);
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManAigSyn4( Gia_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->nRelaxRatio = 40;
    if ( fVerbose )     Gia_ManPrintStats( p, NULL );
    if ( Gia_ManAndNum(p) == 0 )
        return Gia_ManDup(p);
//Gia_ManAigPrintPiLevels( p );
    // perform balancing
    pNew = Gia_ManAreaBalance( p, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    // perform mapping
    pPars->nLutSize = 7;
    pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
//    Gia_ManStop( pTemp );
    // perform extraction
    pNew = Gia_ManPerformFx( pTemp = pNew, ABC_INFINITY, 0, 0, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform mapping
    pPars->nLutSize = 5;
    pNew = Jf_ManPerformMapping( pTemp = pNew, pPars );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
//    Gia_ManStop( pTemp );
    // perform extraction
    pNew = Gia_ManPerformFx( pTemp = pNew, ABC_INFINITY, 0, 0, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
    // perform balancing
    pNew = Gia_ManAreaBalance( pTemp = pNew, 0, ABC_INFINITY, fVeryVerbose, 0 );
    if ( fVerbose )     Gia_ManPrintStats( pNew, NULL );
    Gia_ManStop( pTemp );
//Gia_ManAigPrintPiLevels( pNew );
    return pNew;
}